

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

ssize_t __thiscall
wasm::WasmBinaryReader::read(WasmBinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  ssize_t extraout_RAX;
  ulong uVar4;
  pair<std::__detail::_Node_iterator<unsigned_char,_true,_false>,_bool> pVar5;
  byte local_339;
  string local_320;
  string local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Node_iterator_base<unsigned_char,_false> local_78;
  byte local_70;
  _Node_iterator_base<unsigned_char,_false> local_68;
  byte local_60;
  size_t local_58;
  size_t oldPos;
  allocator<char> local_39;
  string local_38;
  uint32_t local_18;
  byte local_11;
  uint32_t payloadLen;
  uint8_t sectionCode;
  WasmBinaryReader *this_local;
  
  _payloadLen = this;
  if (((this->DWARF & 1U) != 0) && (bVar2 = hasDWARFSections(this), !bVar2)) {
    this->DWARF = false;
  }
  if ((this->debugInfo & 1U) != 0) {
    findAndReadNames(this);
  }
  readHeader(this);
  SourceMapReader::parse(&this->sourceMapReader,this->wasm);
  do {
    bVar2 = more(this);
    if (!bVar2) {
      validateBinary(this);
      return extraout_RAX;
    }
    local_11 = getInt8(this);
    local_18 = getU32LEB(this);
    sVar1 = this->pos;
    uVar4 = (ulong)local_18;
    sVar3 = std::vector<char,_std::allocator<char>_>::size(this->input);
    if (sVar3 < sVar1 + uVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Section extends beyond end of input",&local_39);
      throwError(this,&local_38);
    }
    local_58 = this->pos;
    local_339 = 0;
    if (local_11 != 0) {
      pVar5 = std::
              unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              ::insert(&this->seenSections,&local_11);
      local_78._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_char,_false>._M_cur;
      local_70 = pVar5.second;
      local_339 = local_70 ^ 0xff;
      local_68._M_cur = local_78._M_cur;
      local_60 = local_70;
    }
    if ((local_339 & 1) != 0) {
      std::__cxx11::to_string(&local_b8,(uint)local_11);
      std::operator+(&local_98,"section seen more than once: ",&local_b8);
      throwError(this,&local_98);
    }
    switch(local_11) {
    case 0:
      readCustomSection(this,(ulong)local_18);
      if (local_58 + local_18 < this->pos) {
        std::__cxx11::to_string(&local_178,local_58);
        std::operator+(&local_158,"bad user section size, started at ",&local_178);
        std::operator+(&local_138,&local_158," plus payload ");
        std::__cxx11::to_string(&local_198,local_18);
        std::operator+(&local_118,&local_138,&local_198);
        std::operator+(&local_f8,&local_118," not being equal to new position ");
        std::__cxx11::to_string(&local_1b8,this->pos);
        std::operator+(&local_d8,&local_f8,&local_1b8);
        throwError(this,&local_d8);
      }
      this->pos = local_58 + local_18;
      break;
    case 1:
      readTypes(this);
      break;
    case 2:
      readImports(this);
      break;
    case 3:
      readFunctionSignatures(this);
      break;
    case 4:
      readTableDeclarations(this);
      break;
    case 5:
      readMemories(this);
      break;
    case 6:
      readGlobals(this);
      break;
    case 7:
      readExports(this);
      break;
    case 8:
      readStart(this);
      break;
    case 9:
      readElementSegments(this);
      break;
    case 10:
      if ((this->DWARF & 1U) != 0) {
        this->codeSectionLocation = this->pos;
      }
      readFunctions(this);
      break;
    case 0xb:
      readDataSegments(this);
      break;
    case 0xc:
      readDataSegmentCount(this);
      break;
    case 0xd:
      readTags(this);
      break;
    case 0xe:
      readStrings(this);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"unrecognized section ID: ",&local_1f9);
      std::__cxx11::to_string(&local_220,(uint)local_11);
      std::operator+(&local_1d8,&local_1f8,&local_220);
      throwError(this,&local_1d8);
    }
  } while (this->pos == local_58 + local_18);
  std::__cxx11::to_string(&local_2e0,local_58);
  std::operator+(&local_2c0,"bad section size, started at ",&local_2e0);
  std::operator+(&local_2a0,&local_2c0," plus payload ");
  std::__cxx11::to_string(&local_300,local_18);
  std::operator+(&local_280,&local_2a0,&local_300);
  std::operator+(&local_260,&local_280," not being equal to new position ");
  std::__cxx11::to_string(&local_320,this->pos);
  std::operator+(&local_240,&local_260,&local_320);
  throwError(this,&local_240);
}

Assistant:

void WasmBinaryReader::read() {
  if (DWARF) {
    // In order to update dwarf, we must store info about each IR node's
    // binary position. This has noticeable memory overhead, so we don't do it
    // by default: the user must request it by setting "DWARF", and even if so
    // we scan ahead to see that there actually *are* DWARF sections, so that
    // we don't do unnecessary work.
    if (!hasDWARFSections()) {
      DWARF = false;
    }
  }

  // Skip ahead and read the name section so we know what names to use when we
  // construct module elements.
  if (debugInfo) {
    findAndReadNames();
  }

  readHeader();
  sourceMapReader.parse(wasm);

  // Read sections until the end
  while (more()) {
    uint8_t sectionCode = getInt8();
    uint32_t payloadLen = getU32LEB();
    if (uint64_t(pos) + uint64_t(payloadLen) > input.size()) {
      throwError("Section extends beyond end of input");
    }

    auto oldPos = pos;

    // Note the section in the list of seen sections, as almost no sections can
    // appear more than once, and verify those that shouldn't do not.
    if (sectionCode != BinaryConsts::Section::Custom &&
        !seenSections.insert(sectionCode).second) {
      throwError("section seen more than once: " + std::to_string(sectionCode));
    }

    switch (sectionCode) {
      case BinaryConsts::Section::Start:
        readStart();
        break;
      case BinaryConsts::Section::Memory:
        readMemories();
        break;
      case BinaryConsts::Section::Type:
        readTypes();
        break;
      case BinaryConsts::Section::Import:
        readImports();
        break;
      case BinaryConsts::Section::Function:
        readFunctionSignatures();
        break;
      case BinaryConsts::Section::Code:
        if (DWARF) {
          codeSectionLocation = pos;
        }
        readFunctions();
        break;
      case BinaryConsts::Section::Export:
        readExports();
        break;
      case BinaryConsts::Section::Element:
        readElementSegments();
        break;
      case BinaryConsts::Section::Strings:
        readStrings();
        break;
      case BinaryConsts::Section::Global:
        readGlobals();
        break;
      case BinaryConsts::Section::Data:
        readDataSegments();
        break;
      case BinaryConsts::Section::DataCount:
        readDataSegmentCount();
        break;
      case BinaryConsts::Section::Table:
        readTableDeclarations();
        break;
      case BinaryConsts::Section::Tag:
        readTags();
        break;
      case BinaryConsts::Section::Custom: {
        readCustomSection(payloadLen);
        if (pos > oldPos + payloadLen) {
          throwError("bad user section size, started at " +
                     std::to_string(oldPos) + " plus payload " +
                     std::to_string(payloadLen) +
                     " not being equal to new position " + std::to_string(pos));
        }
        pos = oldPos + payloadLen;
        break;
      }
      default:
        throwError(std::string("unrecognized section ID: ") +
                   std::to_string(sectionCode));
    }

    // make sure we advanced exactly past this section
    if (pos != oldPos + payloadLen) {
      throwError("bad section size, started at " + std::to_string(oldPos) +
                 " plus payload " + std::to_string(payloadLen) +
                 " not being equal to new position " + std::to_string(pos));
    }
  }

  validateBinary();
}